

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<unsigned_long> * __thiscall
irr::core::string<unsigned_long>::operator=(string<unsigned_long> *this,unsigned_long *c)

{
  s32 l;
  ulong uVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  
  puVar2 = this->array;
  if (c == (unsigned_long *)0x0) {
    if (puVar2 == (unsigned_long *)0x0) {
      puVar2 = (unsigned_long *)operator_new__(8);
      this->array = puVar2;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar2 = 0;
  }
  else if (puVar2 != c) {
    if (*c == 0) {
      uVar1 = 1;
    }
    else {
      uVar1 = 1;
      do {
        puVar3 = c + uVar1;
        uVar1 = uVar1 + 1;
      } while (*puVar3 != 0);
    }
    this->used = (s32)uVar1;
    this->allocated = (s32)uVar1;
    puVar3 = (unsigned_long *)operator_new__((uVar1 & 0xffffffff) * 8);
    this->array = puVar3;
    uVar4 = 0;
    do {
      this->array[uVar4] = c[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar1 & 0xffffffff) != uVar4);
    if (puVar2 != (unsigned_long *)0x0) {
      operator_delete__(puVar2);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}